

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int function_addrs_compare(void *v1,void *v2)

{
  function_addrs *a2;
  function_addrs *a1;
  void *v2_local;
  void *v1_local;
  
  if (*v1 < *v2) {
    v1_local._4_4_ = -1;
  }
  else if (*v2 < *v1) {
    v1_local._4_4_ = 1;
  }
  else if (*(ulong *)((long)v1 + 8) < *(ulong *)((long)v2 + 8)) {
    v1_local._4_4_ = 1;
  }
  else if (*(ulong *)((long)v2 + 8) < *(ulong *)((long)v1 + 8)) {
    v1_local._4_4_ = -1;
  }
  else {
    v1_local._4_4_ =
         strcmp((char *)**(undefined8 **)((long)v1 + 0x10),
                (char *)**(undefined8 **)((long)v2 + 0x10));
  }
  return v1_local._4_4_;
}

Assistant:

static int
function_addrs_compare (const void *v1, const void *v2)
{
  const struct function_addrs *a1 = (const struct function_addrs *) v1;
  const struct function_addrs *a2 = (const struct function_addrs *) v2;

  if (a1->low < a2->low)
    return -1;
  if (a1->low > a2->low)
    return 1;
  if (a1->high < a2->high)
    return 1;
  if (a1->high > a2->high)
    return -1;
  return strcmp (a1->function->name, a2->function->name);
}